

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::tryRead
          (AsyncPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  long lVar2;
  PromiseNode *pPVar3;
  void *pvVar4;
  size_t in_R8;
  TransformPromiseNodeBase *this_00;
  ArrayPtr<unsigned_char> readBuffer;
  OwnPromiseNode local_70;
  PromiseNode *local_68;
  OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_60;
  long local_48;
  PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  if (maxBytes == 0) {
    constPromise<unsigned_long,_0UL>();
  }
  else {
    plVar1 = *(long **)((long)buffer + 0x20);
    if (plVar1 == (long *)0x0) {
      pvVar4 = operator_new(0x400);
      local_68 = (PromiseNode *)((long)pvVar4 + 0x1c0);
      local_40 = (PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *)((long)pvVar4 + 0x1d8);
      *(undefined8 *)((long)pvVar4 + 0x1c8) = 0;
      *(undefined8 *)((long)pvVar4 + 0x1d0) = 0;
      *(undefined ***)((long)pvVar4 + 0x1c0) = &PTR_destroy_00674968;
      *(undefined ***)((long)pvVar4 + 0x1d8) = &PTR_reject_006749b8;
      local_48 = (long)pvVar4 + 0x1e0;
      *(undefined1 *)((long)pvVar4 + 0x1e0) = 0;
      *(undefined1 *)((long)pvVar4 + 0x378) = 0;
      *(undefined1 *)((long)pvVar4 + 0x390) = 1;
      local_60._0_8_ = (ulong)(uint)local_60._4_4_ << 0x20;
      readBuffer.size_ = in_R8;
      readBuffer.ptr = (uchar *)minBytes;
      BlockedRead::BlockedRead
                ((BlockedRead *)((long)pvVar4 + 0x398),local_40,(AsyncPipe *)buffer,readBuffer,
                 maxBytes,&local_60);
      *(void **)((long)pvVar4 + 0x1c8) = pvVar4;
      local_60.tag = 0;
      local_60._4_4_ = 0;
      Own<kj::_::AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>,_kj::_::PromiseDisposer>
      ::~Own((Own<kj::_::AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>,_kj::_::PromiseDisposer>
              *)&local_60);
      pPVar3 = local_68;
      local_70.ptr = local_68;
      local_60.tag = 0;
      local_60._4_4_ = 0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_60);
      lVar2 = *(long *)((long)pvVar4 + 0x1c8);
      if (lVar2 == 0 || (ulong)((long)pPVar3 - lVar2) < 0x28) {
        pvVar4 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_70,
                   kj::_::
                   SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:247:17)>
                   ::anon_class_1_0_00000001_for_func::operator());
        *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00674c28;
        *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
      }
      else {
        *(undefined8 *)((long)pvVar4 + 0x1c8) = 0;
        this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x198);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_70,
                   kj::_::
                   SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:247:17)>
                   ::anon_class_1_0_00000001_for_func::operator());
        *(undefined ***)((long)pvVar4 + 0x198) = &PTR_destroy_00674c28;
        *(long *)((long)pvVar4 + 0x1a0) = lVar2;
      }
      local_60.tag = 0;
      local_60._4_4_ = 0;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)this_00;
      local_38.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_60);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
    }
    else {
      (**(code **)(*plVar1 + 8))(this,plVar1,minBytes,maxBytes);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (minBytes == 0) {
      return constPromise<size_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.tryRead(buffer, minBytes, maxBytes);
    } else {
      return newAdaptedPromise<ReadResult, BlockedRead>(
          *this, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes), minBytes)
          .then([](ReadResult r) { return r.byteCount; });
    }